

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O2

bool cvui::mouse(String *theWindowName,int theButton,int theQuery)

{
  bool bVar1;
  cvui_context_t *pcVar2;
  undefined8 extraout_RAX;
  allocator<char> local_31;
  string local_30;
  
  if ((uint)theButton < 3) {
    pcVar2 = internal::getContext(theWindowName);
    bVar1 = internal::isMouseButton((pcVar2->mouse).buttons + (uint)theButton,theQuery);
    return bVar1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "Invalid mouse button. Are you using one of the available: cvui::{RIGHT,MIDDLE,LEFT}_BUTTON ?"
             ,&local_31);
  internal::error(6,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

bool mouse(const cv::String& theWindowName, int theButton, int theQuery) {
	if (theButton != RIGHT_BUTTON && theButton != MIDDLE_BUTTON && theButton != LEFT_BUTTON) {
		internal::error(6, "Invalid mouse button. Are you using one of the available: cvui::{RIGHT,MIDDLE,LEFT}_BUTTON ?");
	}

	cvui_mouse_btn_t& aButton = internal::getContext(theWindowName).mouse.buttons[theButton];
	bool aRet = internal::isMouseButton(aButton, theQuery);

	return aRet;
}